

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O0

int Abc_NtkRRWindow(Abc_RRMan_t *p)

{
  int LevelLimit;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Obj_t *local_50;
  Abc_Obj_t *local_48;
  int RetValue;
  int LevelMax;
  int LevelMin;
  int i;
  Abc_Obj_t *pEdgeFanout;
  Abc_Obj_t *pEdgeFanin;
  Abc_Obj_t *pObj;
  Abc_RRMan_t *p_local;
  
  if (p->pFanout == (Abc_Obj_t *)0x0) {
    local_48 = p->pNode;
  }
  else {
    local_48 = p->pFanout;
  }
  if (p->pFanout == (Abc_Obj_t *)0x0) {
    local_50 = p->pFanin;
  }
  else {
    local_50 = p->pNode;
  }
  LevelLimit = Abc_MaxInt(0,(*(uint *)&p->pFanin->field_0x14 >> 0xc) - p->nFaninLevels);
  iVar1 = (*(uint *)&local_48->field_0x14 >> 0xc) + p->nFanoutLevels;
  Abc_NtkIncrementTravId(p->pNtk);
  Abc_NodeSetTravIdCurrent(p->pFanin);
  Vec_PtrPush(p->vFaninLeaves,p->pFanin);
  do {
    iVar2 = Abc_NtkRRTfi_int(p->vFaninLeaves,LevelLimit);
  } while (iVar2 != 0);
  Abc_NtkIncrementTravId(p->pNtk);
  for (LevelMax = 0; iVar2 = Vec_PtrSize(p->vFaninLeaves), LevelMax < iVar2; LevelMax = LevelMax + 1
      ) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p->vFaninLeaves,LevelMax);
    Abc_NodeSetTravIdCurrent(pAVar3);
  }
  do {
    iVar2 = Abc_NtkRRTfo_int(p->vFaninLeaves,p->vFanoutRoots,iVar1,local_50,local_48);
  } while (iVar2 != 0);
  for (LevelMax = 0; iVar2 = Vec_PtrSize(p->vFanoutRoots), LevelMax < iVar2; LevelMax = LevelMax + 1
      ) {
    pvVar4 = Vec_PtrEntry(p->vFanoutRoots,LevelMax);
    *(uint *)((long)pvVar4 + 0x14) = *(uint *)((long)pvVar4 + 0x14) & 0xffffffef | 0x10;
  }
  iVar1 = Abc_NtkRRTfo_rec(local_48,p->vRoots,iVar1 + 1);
  for (LevelMax = 0; iVar2 = Vec_PtrSize(p->vFanoutRoots), LevelMax < iVar2; LevelMax = LevelMax + 1
      ) {
    pvVar4 = Vec_PtrEntry(p->vFanoutRoots,LevelMax);
    *(uint *)((long)pvVar4 + 0x14) = *(uint *)((long)pvVar4 + 0x14) & 0xffffffef;
  }
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    Abc_NtkIncrementTravId(p->pNtk);
    for (LevelMax = 0; iVar1 = Vec_PtrSize(p->vRoots), LevelMax < iVar1; LevelMax = LevelMax + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,LevelMax);
      Abc_NtkRRTfi_rec(pAVar3,p->vLeaves,p->vCone,LevelLimit);
    }
    pAVar5 = Abc_NtkWindow(p->pNtk,p->vLeaves,p->vCone,p->vRoots);
    p->pWnd = pAVar5;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkRRWindow( Abc_RRMan_t * p )
{
    Abc_Obj_t * pObj, * pEdgeFanin, * pEdgeFanout;
    int i, LevelMin, LevelMax, RetValue;

    // get the edge
    pEdgeFanout = p->pFanout? p->pFanout : p->pNode;
    pEdgeFanin  = p->pFanout? p->pNode : p->pFanin;
    // get the minimum and maximum levels of the window
    LevelMin = Abc_MaxInt( 0, ((int)p->pFanin->Level) - p->nFaninLevels );
    LevelMax = (int)pEdgeFanout->Level + p->nFanoutLevels;

    // start the TFI leaves with the fanin
    Abc_NtkIncrementTravId( p->pNtk );
    Abc_NodeSetTravIdCurrent( p->pFanin );
    Vec_PtrPush( p->vFaninLeaves, p->pFanin );
    // mark the TFI cone and collect the leaves down to the given level
    while ( Abc_NtkRRTfi_int(p->vFaninLeaves, LevelMin) );

    // mark the leaves with the new TravId
    Abc_NtkIncrementTravId( p->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    // traverse the TFO cone of the leaves (while skipping the edge)
    // (a) mark the nodes in the cone using the current TravId
    // (b) collect the nodes that have external fanouts into p->vFanoutRoots
    while ( Abc_NtkRRTfo_int(p->vFaninLeaves, p->vFanoutRoots, LevelMax, pEdgeFanin, pEdgeFanout) );

    // mark the fanout roots
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanoutRoots, pObj, i )
        pObj->fMarkA = 1;
    // collect roots reachable from the fanout (p->vRoots)
    RetValue = Abc_NtkRRTfo_rec( pEdgeFanout, p->vRoots, LevelMax + 1 );
    // unmark the fanout roots
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanoutRoots, pObj, i )
        pObj->fMarkA = 0;

    // return if the window is infeasible
    if ( RetValue == 0 )
        return 0;

    // collect the DFS-ordered new cone (p->vCone) and new leaves (p->vLeaves)
    // using the previous marks coming from the TFO cone
    Abc_NtkIncrementTravId( p->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Abc_NtkRRTfi_rec( pObj, p->vLeaves, p->vCone, LevelMin );

    // create a new network
    p->pWnd = Abc_NtkWindow( p->pNtk, p->vLeaves, p->vCone, p->vRoots );
    return 1;
}